

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

int duckdb_re2::Fanout(Prog *prog,vector<int,_std::allocator<int>_> *histogram)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  SparseArray<int> fanout;
  int data [32];
  SparseArray<int> local_d0;
  int local_a8 [34];
  
  SparseArray<int>::SparseArray(&local_d0,prog->size_);
  Prog::Fanout(prog,&local_d0);
  local_a8[0x1c] = 0;
  local_a8[0x1d] = 0;
  local_a8[0x1e] = 0;
  local_a8[0x1f] = 0;
  local_a8[0x18] = 0;
  local_a8[0x19] = 0;
  local_a8[0x1a] = 0;
  local_a8[0x1b] = 0;
  local_a8[0x14] = 0;
  local_a8[0x15] = 0;
  local_a8[0x16] = 0;
  local_a8[0x17] = 0;
  local_a8[0x10] = 0;
  local_a8[0x11] = 0;
  local_a8[0x12] = 0;
  local_a8[0x13] = 0;
  local_a8[0xc] = 0;
  local_a8[0xd] = 0;
  local_a8[0xe] = 0;
  local_a8[0xf] = 0;
  local_a8[8] = 0;
  local_a8[9] = 0;
  local_a8[10] = 0;
  local_a8[0xb] = 0;
  local_a8[4] = 0;
  local_a8[5] = 0;
  local_a8[6] = 0;
  local_a8[7] = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  if ((long)local_d0.size_ == 0) {
    uVar3 = 0;
  }
  else {
    lVar2 = 0;
    uVar3 = 0;
    do {
      iVar1 = *(int *)((long)&(local_d0.dense_.ptr_._M_t.
                               super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                               ._M_t.
                               super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                               .
                               super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>
                              ._M_head_impl)->value_ + lVar2);
      if (iVar1 != 0) {
        uVar4 = iVar1 - 1;
        if (uVar4 == 0) {
          uVar5 = 0x20;
        }
        else {
          uVar5 = 0x1f;
          if (uVar4 != 0) {
            for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
            }
          }
          uVar5 = uVar5 ^ 0x1f;
        }
        local_a8[0x20 - uVar5] = local_a8[0x20 - uVar5] + 1;
        if ((int)uVar3 <= (int)(0x21 - uVar5)) {
          uVar3 = 0x21 - uVar5;
        }
      }
      lVar2 = lVar2 + 8;
    } while ((long)local_d0.size_ * 8 != lVar2);
  }
  if (histogram != (vector<int,_std::allocator<int>_> *)0x0) {
    std::vector<int,std::allocator<int>>::_M_assign_aux<int*>
              ((vector<int,std::allocator<int>> *)histogram,local_a8,local_a8 + uVar3);
  }
  SparseArray<int>::~SparseArray(&local_d0);
  return uVar3 - 1;
}

Assistant:

static int Fanout(Prog* prog, std::vector<int>* histogram) {
  SparseArray<int> fanout(prog->size());
  prog->Fanout(&fanout);
  int data[32] = {};
  int size = 0;
  for (SparseArray<int>::iterator i = fanout.begin(); i != fanout.end(); ++i) {
    if (i->value() == 0)
      continue;
    uint32_t value = i->value();
    int bucket = FindMSBSet(value);
    bucket += value & (value-1) ? 1 : 0;
    ++data[bucket];
    size = std::max(size, bucket+1);
  }
  if (histogram != NULL)
    histogram->assign(data, data+size);
  return size-1;
}